

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseUpgrader.cpp
# Opt level: O2

void migrate_version(string_view path)

{
  __type_conflict2 _Var1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string_view path_00;
  string_view_t fmt;
  string_view filename;
  string db_name;
  string version;
  string prev_version;
  json db_json;
  string most_recent;
  string_view path_local;
  path db_root;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&most_recent,"1.5.0",(allocator<char> *)&db_root);
  prev_version._M_dataplus._M_p = (pointer)&prev_version.field_2;
  prev_version._M_string_length = 0;
  prev_version.field_2._M_local_buf[0] = '\0';
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)&version,&path_local);
  std::experimental::filesystem::v1::__cxx11::path::parent_path();
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&version);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)&db_json,&path_local);
  std::experimental::filesystem::v1::__cxx11::path::filename((path *)&version,(path *)&db_json);
  std::__cxx11::string::string((string *)&db_name,(string *)&version);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&version);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&db_json);
  while( true ) {
    path_00._M_str = (char *)db_name._M_string_length;
    path_00._M_len = (size_t)&db_root;
    read_json((path *)&version,path_00);
    db_json.m_type = (value_t)version._M_dataplus._M_p;
    db_json.m_value.number_unsigned = version._M_string_length;
    version._M_dataplus._M_p._0_1_ = null;
    version._M_string_length = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&version);
    extract_version(&version,&db_json);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &version,&prev_version);
    if (_Var1) break;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &version,&prev_version);
    if ((bVar2) && (prev_version._M_string_length != 0)) {
      fmt.size_ = (size_t)&prev_version;
      fmt.data_ = (char *)0x12;
      spdlog::info<std::__cxx11::string,std::__cxx11::string>
                ((spdlog *)"UPGRADE: {} -> {}.",fmt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&version,in_R8
                );
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &version,&most_recent);
    if (_Var1) goto LAB_001476b6;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &version,"1.0.0");
    if (bVar2) {
      upgrade_v1_0_0(&db_json);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &version,"1.3.2");
    if (bVar2) {
      upgrade_v1_3_2(&db_root,&db_json);
    }
    std::__cxx11::string::_M_assign((string *)&prev_version);
    filename._M_str = db_name._M_dataplus._M_p;
    filename._M_len = db_name._M_string_length;
    save_json(&db_root,filename,&db_json);
    std::__cxx11::string::~string((string *)&version);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&db_json);
  }
  spdlog::error<char[47]>((char (*) [47])"Upgrade procedure failed. Trying to proceed...");
LAB_001476b6:
  std::__cxx11::string::~string((string *)&version);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&db_json);
  std::__cxx11::string::~string((string *)&db_name);
  std::experimental::filesystem::v1::__cxx11::path::~path(&db_root);
  std::__cxx11::string::~string((string *)&prev_version);
  std::__cxx11::string::~string((string *)&most_recent);
  return;
}

Assistant:

void migrate_version(std::string_view path) {
    std::string most_recent = "1.5.0";
    std::string prev_version;
    auto db_root = fs::path(path).parent_path();
    auto db_name = std::string(fs::path(path).filename());
    while (true) {
        json db_json = std::move(read_json(db_root, db_name));
        std::string version = extract_version(db_json);
        if (version == prev_version) {
            spdlog::error("Upgrade procedure failed. Trying to proceed...");
            break;
        }
        if (version != prev_version && !prev_version.empty()) {
            spdlog::info("UPGRADE: {} -> {}.", prev_version, version);
        }
        if (version == most_recent) {
            break;
        }
        if (version == "1.0.0") {
            upgrade_v1_0_0(&db_json);
        }
        if (version == "1.3.2") {
            upgrade_v1_3_2(db_root, &db_json);
        }
        prev_version = version;
        save_json(db_root, db_name, db_json);
    }
}